

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O0

UINT8 CPConv_Init(CPCONV **retCPC,char *cpFrom,char *cpTo)

{
  CPCONV *pCVar1;
  char *pcVar2;
  iconv_t pvVar3;
  CPCONV *cpc;
  char *cpTo_local;
  char *cpFrom_local;
  CPCONV **retCPC_local;
  
  pCVar1 = (CPCONV *)calloc(1,0x18);
  if (pCVar1 == (CPCONV *)0x0) {
    retCPC_local._7_1_ = 0xff;
  }
  else {
    pcVar2 = strdup(cpFrom);
    pCVar1->cpFrom = pcVar2;
    pcVar2 = strdup(cpTo);
    pCVar1->cpTo = pcVar2;
    pvVar3 = iconv_open(pCVar1->cpTo,pCVar1->cpFrom);
    pCVar1->hIConv = pvVar3;
    if (pCVar1->hIConv == (iconv_t)0xffffffffffffffff) {
      free(pCVar1->cpFrom);
      free(pCVar1->cpTo);
      retCPC_local._7_1_ = 0x80;
    }
    else {
      *retCPC = pCVar1;
      retCPC_local._7_1_ = '\0';
    }
  }
  return retCPC_local._7_1_;
}

Assistant:

UINT8 CPConv_Init(CPCONV** retCPC, const char* cpFrom, const char* cpTo)
{
	CPCONV* cpc;
	
	cpc = (CPCONV*)calloc(1, sizeof(CPCONV));
	if (cpc == NULL)
		return 0xFF;
	
	cpc->cpFrom = strdup(cpFrom);
	cpc->cpTo = strdup(cpTo);
	cpc->hIConv = iconv_open(cpc->cpTo, cpc->cpFrom);
	if (cpc->hIConv == (iconv_t)-1)
	{
		free(cpc->cpFrom);
		free(cpc->cpTo);
		return 0x80;
	}
	
	*retCPC = cpc;
	return 0x00;
}